

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SAXParser::parse(SAXParser *this,InputSource *source)

{
  IOException *this_00;
  OutOfMemoryException *anon_var_0;
  undefined1 local_40 [8];
  ResetInProgressType_conflict1 resetInProgress;
  InputSource *source_local;
  SAXParser *this_local;
  
  if ((this->fParseInProgress & 1U) != 0) {
    this_00 = (IOException *)__cxa_allocate_exception(0x30);
    IOException::IOException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/parsers/SAXParser.cpp"
               ,0x242,Gen_ParseInProgress,this->fMemoryManager);
    __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
  }
  JanitorMemFunCall<xercesc_4_0::SAXParser>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::SAXParser> *)local_40,this,
             (MFPT)SAXParser::resetInProgress);
  this->fParseInProgress = true;
  (*(this->fScanner->super_XMLBufferFullHandler)._vptr_XMLBufferFullHandler[7])
            (this->fScanner,source);
  JanitorMemFunCall<xercesc_4_0::SAXParser>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::SAXParser> *)local_40);
  return;
}

Assistant:

void SAXParser::parse(const InputSource& source)
{
    // Avoid multiple entrance
    if (fParseInProgress)
        ThrowXMLwithMemMgr(IOException, XMLExcepts::Gen_ParseInProgress, fMemoryManager);

    ResetInProgressType     resetInProgress(this, &SAXParser::resetInProgress);

    try
    {
        fParseInProgress = true;
        fScanner->scanDocument(source);
    }
    catch(const OutOfMemoryException&)
    {
        resetInProgress.release();

        throw;
    }
}